

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O1

bool test_uintwide_t_edge::test_various_ostream_ops(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort *puVar2;
  uint *puVar3;
  ushort uVar4;
  ushort uVar5;
  size_t sVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  unsigned_long uVar11;
  ulong uVar12;
  uint i_1;
  byte bVar13;
  long lVar14;
  undefined8 *puVar15;
  uint i;
  byte bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  string str_ctrl;
  uintwide_t<256U,_unsigned_short,_void,_false> result_max;
  local_uintwide_t_small_unsigned_type u;
  stringstream strm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  uintwide_t<256U,_unsigned_short,_void,_false> local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  uVar11 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  uVar12 = 0x12dd397;
  if (uVar11 != 0) {
    uVar12 = uVar11 % 0x7fffffab + (ulong)(uVar11 % 0x7fffffab == 0);
  }
  lVar14 = 0;
  puVar15 = &eng_sgn;
  do {
    uVar12 = (uVar12 * 0x9c4e) % 0x7fffffab;
    *(ulong *)((long)&eng_sgn + lVar14) = (ulong)((uint)uVar12 & 0xffffff);
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0xc0);
  _DAT_00212400 = (ulong)(DAT_002123f8 == 0);
  _DAT_00212408 = (undefined1  [16])0x0;
  uVar11 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>::seed
            ((subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL> *)eng_dig,uVar11);
  eng_dig._112_8_ = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[0] = 0x72b3;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
  puVar3 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
  *puVar3 = *puVar3 | 0x200;
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 100;
  lVar14 = *(long *)(local_1a8[0] + -0x18);
  if (acStack_c8[lVar14 + 1] == '\0') {
    cVar7 = std::ios::widen((char)&local_218 + (char)lVar14 + 'p');
    acStack_c8[lVar14] = cVar7;
    acStack_c8[lVar14 + 1] = '\x01';
  }
  acStack_c8[lVar14] = '#';
  math::wide_integer::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&local_1d8);
  paVar1 = &local_218.field_2;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_218,100,'#');
  uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                    CONCAT24(local_218._M_string_length._4_2_,(undefined4)local_218._M_string_length
                            ));
  if (4 < uVar12) {
    local_218._M_dataplus._M_p[uVar12 - 5] = '2';
    uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                      CONCAT24(local_218._M_string_length._4_2_,
                               (undefined4)local_218._M_string_length));
    if (3 < uVar12) {
      local_218._M_dataplus._M_p[uVar12 - 4] = '9';
      uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                        CONCAT24(local_218._M_string_length._4_2_,
                                 (undefined4)local_218._M_string_length));
      if (2 < uVar12) {
        local_218._M_dataplus._M_p[uVar12 - 3] = '3';
        uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                          CONCAT24(local_218._M_string_length._4_2_,
                                   (undefined4)local_218._M_string_length));
        if (1 < uVar12) {
          local_218._M_dataplus._M_p[uVar12 - 2] = '6';
          lVar14 = CONCAT26(local_218._M_string_length._6_2_,
                            CONCAT24(local_218._M_string_length._4_2_,
                                     (undefined4)local_218._M_string_length));
          if (lVar14 != 0) {
            local_218._M_dataplus._M_p[lVar14 + -1] = '3';
            std::__cxx11::stringbuf::str();
            sVar6 = CONCAT44(uStack_1ec,uStack_1f0);
            if (sVar6 == CONCAT26(local_218._M_string_length._6_2_,
                                  CONCAT24(local_218._M_string_length._4_2_,
                                           (undefined4)local_218._M_string_length))) {
              if (sVar6 == 0) {
                bVar17 = true;
              }
              else {
                iVar8 = bcmp((void *)CONCAT44(uStack_1f4,local_1f8),local_218._M_dataplus._M_p,sVar6
                            );
                bVar17 = iVar8 == 0;
              }
            }
            else {
              bVar17 = false;
            }
            if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8) {
              operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8),
                              CONCAT44(uStack_1e4,local_1e8) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != paVar1) {
              operator_delete(local_218._M_dataplus._M_p,
                              CONCAT26(local_218.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_218.field_2._M_allocated_capacity._4_2_,
                                                CONCAT22(local_218.field_2._M_allocated_capacity.
                                                         _2_2_,local_218.field_2.
                                                               _M_allocated_capacity._0_2_))) + 1);
            }
            std::__cxx11::stringstream::~stringstream(local_1b8);
            std::ios_base::~ios_base(local_138);
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[0] = 0xa2f7;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
            std::__cxx11::stringstream::stringstream(local_1b8);
            *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
            puVar3 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
            *puVar3 = *puVar3 | 0x4000;
            puVar3 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
            *puVar3 = *puVar3 | 0x200;
            *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 100;
            lVar14 = *(long *)(local_1a8[0] + -0x18);
            if (acStack_c8[lVar14 + 1] == '\0') {
              cVar7 = std::ios::widen((char)&local_218 + (char)lVar14 + 'p');
              acStack_c8[lVar14] = cVar7;
              acStack_c8[lVar14 + 1] = '\x01';
            }
            acStack_c8[lVar14] = '#';
            math::wide_integer::operator<<
                      ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&local_1d8);
            local_218._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct(&local_218,100,'#');
            uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                              CONCAT24(local_218._M_string_length._4_2_,
                                       (undefined4)local_218._M_string_length));
            if (5 < uVar12) {
              local_218._M_dataplus._M_p[uVar12 - 6] = '0';
              uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                                CONCAT24(local_218._M_string_length._4_2_,
                                         (undefined4)local_218._M_string_length));
              if (4 < uVar12) {
                local_218._M_dataplus._M_p[uVar12 - 5] = 'X';
                uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                                  CONCAT24(local_218._M_string_length._4_2_,
                                           (undefined4)local_218._M_string_length));
                if (3 < uVar12) {
                  local_218._M_dataplus._M_p[uVar12 - 4] = 'A';
                  uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                                    CONCAT24(local_218._M_string_length._4_2_,
                                             (undefined4)local_218._M_string_length));
                  if (2 < uVar12) {
                    local_218._M_dataplus._M_p[uVar12 - 3] = '2';
                    uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                                      CONCAT24(local_218._M_string_length._4_2_,
                                               (undefined4)local_218._M_string_length));
                    if (1 < uVar12) {
                      local_218._M_dataplus._M_p[uVar12 - 2] = 'F';
                      lVar14 = CONCAT26(local_218._M_string_length._6_2_,
                                        CONCAT24(local_218._M_string_length._4_2_,
                                                 (undefined4)local_218._M_string_length));
                      if (lVar14 != 0) {
                        local_218._M_dataplus._M_p[lVar14 + -1] = '7';
                        std::__cxx11::stringbuf::str();
                        sVar6 = CONCAT44(uStack_1ec,uStack_1f0);
                        if (sVar6 == CONCAT26(local_218._M_string_length._6_2_,
                                              CONCAT24(local_218._M_string_length._4_2_,
                                                       (undefined4)local_218._M_string_length))) {
                          if (sVar6 == 0) {
                            bVar18 = true;
                          }
                          else {
                            iVar8 = bcmp((void *)CONCAT44(uStack_1f4,local_1f8),
                                         local_218._M_dataplus._M_p,sVar6);
                            bVar18 = iVar8 == 0;
                          }
                        }
                        else {
                          bVar18 = false;
                        }
                        if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8) {
                          operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8),
                                          CONCAT44(uStack_1e4,local_1e8) + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._M_dataplus._M_p != paVar1) {
                          operator_delete(local_218._M_dataplus._M_p,
                                          CONCAT26(local_218.field_2._M_allocated_capacity._6_2_,
                                                   CONCAT24(local_218.field_2._M_allocated_capacity.
                                                            _4_2_,CONCAT22(local_218.field_2.
                                                                           _M_allocated_capacity.
                                                                           _2_2_,local_218.field_2.
                                                                                                                                                                  
                                                  _M_allocated_capacity._0_2_))) + 1);
                        }
                        std::__cxx11::stringstream::~stringstream(local_1b8);
                        std::ios_base::~ios_base(local_138);
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[0] = 0x72b3;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
                        std::__cxx11::stringstream::stringstream(local_1b8);
                        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) &
                             0xffffffb5 | 0x40;
                        puVar3 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
                        *puVar3 = *puVar3 | 0x4000;
                        puVar3 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
                        *puVar3 = *puVar3 | 0x200;
                        *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 100;
                        lVar14 = *(long *)(local_1a8[0] + -0x18);
                        if (acStack_c8[lVar14 + 1] == '\0') {
                          cVar7 = std::ios::widen((char)&local_218 + (char)lVar14 + 'p');
                          acStack_c8[lVar14] = cVar7;
                          acStack_c8[lVar14 + 1] = '\x01';
                        }
                        acStack_c8[lVar14] = '#';
                        math::wide_integer::operator<<
                                  ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,
                                   &local_1d8);
                        local_218._M_dataplus._M_p = (pointer)paVar1;
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        _M_construct(&local_218,100,'#');
                        uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                                          CONCAT24(local_218._M_string_length._4_2_,
                                                   (undefined4)local_218._M_string_length));
                        if (5 < uVar12) {
                          local_218._M_dataplus._M_p[uVar12 - 6] = '0';
                          uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                                            CONCAT24(local_218._M_string_length._4_2_,
                                                     (undefined4)local_218._M_string_length));
                          if (4 < uVar12) {
                            local_218._M_dataplus._M_p[uVar12 - 5] = '7';
                            uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                                              CONCAT24(local_218._M_string_length._4_2_,
                                                       (undefined4)local_218._M_string_length));
                            if (3 < uVar12) {
                              local_218._M_dataplus._M_p[uVar12 - 4] = '1';
                              uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                                                CONCAT24(local_218._M_string_length._4_2_,
                                                         (undefined4)local_218._M_string_length));
                              if (2 < uVar12) {
                                local_218._M_dataplus._M_p[uVar12 - 3] = '2';
                                uVar12 = CONCAT26(local_218._M_string_length._6_2_,
                                                  CONCAT24(local_218._M_string_length._4_2_,
                                                           (undefined4)local_218._M_string_length));
                                if (1 < uVar12) {
                                  local_218._M_dataplus._M_p[uVar12 - 2] = '6';
                                  lVar14 = CONCAT26(local_218._M_string_length._6_2_,
                                                    CONCAT24(local_218._M_string_length._4_2_,
                                                             (undefined4)local_218._M_string_length)
                                                   );
                                  if (lVar14 != 0) {
                                    local_218._M_dataplus._M_p[lVar14 + -1] = '3';
                                    std::__cxx11::stringbuf::str();
                                    sVar6 = CONCAT44(uStack_1ec,uStack_1f0);
                                    if (sVar6 == CONCAT26(local_218._M_string_length._6_2_,
                                                          CONCAT24(local_218._M_string_length._4_2_,
                                                                   (undefined4)
                                                                   local_218._M_string_length))) {
                                      if (sVar6 == 0) {
                                        bVar19 = true;
                                      }
                                      else {
                                        iVar8 = bcmp((void *)CONCAT44(uStack_1f4,local_1f8),
                                                     local_218._M_dataplus._M_p,sVar6);
                                        bVar19 = iVar8 == 0;
                                      }
                                    }
                                    else {
                                      bVar19 = false;
                                    }
                                    if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8)
                                    {
                                      operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8),
                                                      CONCAT44(uStack_1e4,local_1e8) + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_218._M_dataplus._M_p != paVar1) {
                                      operator_delete(local_218._M_dataplus._M_p,
                                                      CONCAT26(local_218.field_2.
                                                               _M_allocated_capacity._6_2_,
                                                               CONCAT24(local_218.field_2.
                                                                        _M_allocated_capacity._4_2_,
                                                                        CONCAT22(local_218.field_2.
                                                                                                                                                                  
                                                  _M_allocated_capacity._2_2_,
                                                  local_218.field_2._M_allocated_capacity._0_2_))) +
                                                  1);
                                    }
                                    std::__cxx11::stringstream::~stringstream(local_1b8);
                                    std::ios_base::~ios_base(local_138);
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0
                                    ;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xb] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xc] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xd] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xe] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xf] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
                                    std::__cxx11::stringstream::stringstream(local_1b8);
                                    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                                         *(uint *)((long)auStack_190 +
                                                  *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 |
                                         0x40;
                                    math::wide_integer::operator<<
                                              ((basic_ostream<char,_std::char_traits<char>_> *)
                                               local_1a8,&local_1d8);
                                    std::__cxx11::stringbuf::str();
                                    iVar8 = std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            ::compare(&local_218,"0");
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_218._M_dataplus._M_p != paVar1) {
                                      operator_delete(local_218._M_dataplus._M_p,
                                                      CONCAT26(local_218.field_2.
                                                               _M_allocated_capacity._6_2_,
                                                               CONCAT24(local_218.field_2.
                                                                        _M_allocated_capacity._4_2_,
                                                                        CONCAT22(local_218.field_2.
                                                                                                                                                                  
                                                  _M_allocated_capacity._2_2_,
                                                  local_218.field_2._M_allocated_capacity._0_2_))) +
                                                  1);
                                    }
                                    std::__cxx11::stringstream::~stringstream(local_1b8);
                                    std::ios_base::~ios_base(local_138);
                                    std::__cxx11::stringstream::stringstream(local_1b8);
                                    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                                         *(uint *)((long)auStack_190 +
                                                  *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
                                    math::wide_integer::operator<<
                                              ((basic_ostream<char,_std::char_traits<char>_> *)
                                               local_1a8,&local_1d8);
                                    std::__cxx11::stringbuf::str();
                                    iVar9 = std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            ::compare(&local_218,"0");
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_218._M_dataplus._M_p != &local_218.field_2) {
                                      operator_delete(local_218._M_dataplus._M_p,
                                                      CONCAT26(local_218.field_2.
                                                               _M_allocated_capacity._6_2_,
                                                               CONCAT24(local_218.field_2.
                                                                        _M_allocated_capacity._4_2_,
                                                                        CONCAT22(local_218.field_2.
                                                                                                                                                                  
                                                  _M_allocated_capacity._2_2_,
                                                  local_218.field_2._M_allocated_capacity._0_2_))) +
                                                  1);
                                    }
                                    std::__cxx11::stringstream::~stringstream(local_1b8);
                                    std::ios_base::~ios_base(local_138);
                                    std::__cxx11::stringstream::stringstream(local_1b8);
                                    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                                         *(uint *)((long)auStack_190 +
                                                  *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
                                    math::wide_integer::operator<<
                                              ((basic_ostream<char,_std::char_traits<char>_> *)
                                               local_1a8,&local_1d8);
                                    std::__cxx11::stringbuf::str();
                                    iVar10 = std::__cxx11::
                                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             ::compare(&local_218,"0");
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_218._M_dataplus._M_p != &local_218.field_2) {
                                      operator_delete(local_218._M_dataplus._M_p,
                                                      CONCAT26(local_218.field_2.
                                                               _M_allocated_capacity._6_2_,
                                                               CONCAT24(local_218.field_2.
                                                                        _M_allocated_capacity._4_2_,
                                                                        CONCAT22(local_218.field_2.
                                                                                                                                                                  
                                                  _M_allocated_capacity._2_2_,
                                                  local_218.field_2._M_allocated_capacity._0_2_))) +
                                                  1);
                                    }
                                    bVar16 = bVar17 & bVar18 & bVar19 &
                                             ((iVar9 == 0 && iVar8 == 0) && iVar10 == 0);
                                    std::__cxx11::stringstream::~stringstream(local_1b8);
                                    std::ios_base::~ios_base(local_138);
                                    iVar8 = 0;
                                    do {
                                      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                                                (&local_1d8,(test_uintwide_t_edge *)0x1,false,0x4d,
                                                 (int)puVar15);
                                      std::__cxx11::stringstream::stringstream(local_1b8);
                                      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18))
                                           = *(uint *)((long)auStack_190 +
                                                      *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5
                                             | 2;
                                      math::wide_integer::operator<<
                                                ((basic_ostream<char,_std::char_traits<char>_> *)
                                                 local_1a8,&local_1d8);
                                      std::__cxx11::stringbuf::str();
                                      local_218._M_dataplus._M_p._0_4_ = 0;
                                      local_218._M_dataplus._M_p._4_4_ = 0;
                                      local_218._M_string_length._0_4_ = 0;
                                      local_218._M_string_length._4_2_ = 0;
                                      local_218._M_string_length._6_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._0_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._2_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._4_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._6_2_ = 0;
                                      local_218.field_2._8_2_ = 0;
                                      local_218.field_2._10_2_ = 0;
                                      local_218.field_2._12_2_ = 0;
                                      local_218.field_2._14_2_ = 0;
                                      bVar17 = math::wide_integer::
                                               uintwide_t<256U,_unsigned_short,_void,_false>::
                                               rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_false> *)
                                                  &local_218,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                      if (!bVar17) {
                                        local_218.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                        local_218.field_2._8_2_ = 0xffff;
                                        local_218.field_2._10_2_ = 0xffff;
                                        local_218.field_2._12_2_ = 0xffff;
                                        local_218.field_2._14_2_ = 0xffff;
                                        local_218._M_dataplus._M_p._0_4_ = 0xffffffff;
                                        local_218._M_dataplus._M_p._4_4_ = 0xffffffff;
                                        local_218._M_string_length._0_4_ = 0xffffffff;
                                        local_218._M_string_length._4_2_ = 0xffff;
                                        local_218._M_string_length._6_2_ = 0xffff;
                                      }
                                      if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8
                                         ) {
                                        operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8)
                                                        ,CONCAT44(uStack_1e4,local_1e8) + 1);
                                      }
                                      lVar14 = 0x1e;
                                      do {
                                        bVar13 = 0;
                                        if (lVar14 == -2) break;
                                        uVar4 = *(ushort *)
                                                 ((long)local_1d8.values.
                                                        super_array<unsigned_short,_16UL>.elems +
                                                 lVar14);
                                        uVar5 = *(ushort *)
                                                 ((long)&local_218._M_dataplus._M_p + lVar14);
                                        bVar13 = -(uVar4 <= uVar5) | 1;
                                        lVar14 = lVar14 + -2;
                                      } while (uVar4 == uVar5);
                                      bVar16 = bVar16 & bVar13 == 0;
                                      std::__cxx11::stringstream::~stringstream(local_1b8);
                                      std::ios_base::~ios_base(local_138);
                                      iVar8 = iVar8 + 1;
                                    } while (iVar8 != 0x400);
                                    iVar8 = 0;
                                    do {
                                      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                                                (&local_1d8,(test_uintwide_t_edge *)0x1,true,0x40,
                                                 (int)puVar15);
                                      std::__cxx11::stringstream::stringstream(local_1b8);
                                      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18))
                                           = *(uint *)((long)auStack_190 +
                                                      *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5
                                             | 8;
                                      puVar3 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar3 = *puVar3 | 0x200;
                                      math::wide_integer::operator<<
                                                ((basic_ostream<char,_std::char_traits<char>_> *)
                                                 local_1a8,&local_1d8);
                                      std::__cxx11::stringbuf::str();
                                      local_218._M_dataplus._M_p._0_4_ = 0;
                                      local_218._M_dataplus._M_p._4_4_ = 0;
                                      local_218._M_string_length._0_4_ = 0;
                                      local_218._M_string_length._4_2_ = 0;
                                      local_218._M_string_length._6_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._0_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._2_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._4_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._6_2_ = 0;
                                      local_218.field_2._8_2_ = 0;
                                      local_218.field_2._10_2_ = 0;
                                      local_218.field_2._12_2_ = 0;
                                      local_218.field_2._14_2_ = 0;
                                      bVar17 = math::wide_integer::
                                               uintwide_t<256U,_unsigned_short,_void,_false>::
                                               rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_false> *)
                                                  &local_218,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                      if (!bVar17) {
                                        local_218.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                        local_218.field_2._8_2_ = 0xffff;
                                        local_218.field_2._10_2_ = 0xffff;
                                        local_218.field_2._12_2_ = 0xffff;
                                        local_218.field_2._14_2_ = 0xffff;
                                        local_218._M_dataplus._M_p._0_4_ = 0xffffffff;
                                        local_218._M_dataplus._M_p._4_4_ = 0xffffffff;
                                        local_218._M_string_length._0_4_ = 0xffffffff;
                                        local_218._M_string_length._4_2_ = 0xffff;
                                        local_218._M_string_length._6_2_ = 0xffff;
                                      }
                                      if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8
                                         ) {
                                        operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8)
                                                        ,CONCAT44(uStack_1e4,local_1e8) + 1);
                                      }
                                      lVar14 = 0x1e;
                                      do {
                                        bVar13 = 0;
                                        if (lVar14 == -2) break;
                                        uVar4 = *(ushort *)
                                                 ((long)local_1d8.values.
                                                        super_array<unsigned_short,_16UL>.elems +
                                                 lVar14);
                                        uVar5 = *(ushort *)
                                                 ((long)&local_218._M_dataplus._M_p + lVar14);
                                        bVar13 = -(uVar4 <= uVar5) | 1;
                                        lVar14 = lVar14 + -2;
                                      } while (uVar4 == uVar5);
                                      bVar16 = bVar16 & bVar13 == 0;
                                      std::__cxx11::stringstream::~stringstream(local_1b8);
                                      std::ios_base::~ios_base(local_138);
                                      iVar8 = iVar8 + 1;
                                    } while (iVar8 != 0x400);
                                    iVar8 = 0;
                                    do {
                                      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                                                (&local_1d8,(test_uintwide_t_edge *)0x1,true,0x55,
                                                 (int)puVar15);
                                      std::__cxx11::stringstream::stringstream(local_1b8);
                                      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18))
                                           = *(uint *)((long)auStack_190 +
                                                      *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5
                                             | 0x40;
                                      puVar3 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar3 = *puVar3 | 0x200;
                                      math::wide_integer::operator<<
                                                ((basic_ostream<char,_std::char_traits<char>_> *)
                                                 local_1a8,&local_1d8);
                                      std::__cxx11::stringbuf::str();
                                      local_218._M_dataplus._M_p._0_4_ = 0;
                                      local_218._M_dataplus._M_p._4_4_ = 0;
                                      local_218._M_string_length._0_4_ = 0;
                                      local_218._M_string_length._4_2_ = 0;
                                      local_218._M_string_length._6_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._0_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._2_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._4_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._6_2_ = 0;
                                      local_218.field_2._8_2_ = 0;
                                      local_218.field_2._10_2_ = 0;
                                      local_218.field_2._12_2_ = 0;
                                      local_218.field_2._14_2_ = 0;
                                      bVar17 = math::wide_integer::
                                               uintwide_t<256U,_unsigned_short,_void,_false>::
                                               rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_false> *)
                                                  &local_218,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                      if (!bVar17) {
                                        local_218.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                        local_218.field_2._8_2_ = 0xffff;
                                        local_218.field_2._10_2_ = 0xffff;
                                        local_218.field_2._12_2_ = 0xffff;
                                        local_218.field_2._14_2_ = 0xffff;
                                        local_218._M_dataplus._M_p._0_4_ = 0xffffffff;
                                        local_218._M_dataplus._M_p._4_4_ = 0xffffffff;
                                        local_218._M_string_length._0_4_ = 0xffffffff;
                                        local_218._M_string_length._4_2_ = 0xffff;
                                        local_218._M_string_length._6_2_ = 0xffff;
                                      }
                                      if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8
                                         ) {
                                        operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8)
                                                        ,CONCAT44(uStack_1e4,local_1e8) + 1);
                                      }
                                      lVar14 = 0x1e;
                                      do {
                                        bVar13 = 0;
                                        if (lVar14 == -2) break;
                                        uVar4 = *(ushort *)
                                                 ((long)local_1d8.values.
                                                        super_array<unsigned_short,_16UL>.elems +
                                                 lVar14);
                                        uVar5 = *(ushort *)
                                                 ((long)&local_218._M_dataplus._M_p + lVar14);
                                        bVar13 = -(uVar4 <= uVar5) | 1;
                                        lVar14 = lVar14 + -2;
                                      } while (uVar4 == uVar5);
                                      bVar16 = bVar16 & bVar13 == 0;
                                      std::__cxx11::stringstream::~stringstream(local_1b8);
                                      std::ios_base::~ios_base(local_138);
                                      iVar8 = iVar8 + 1;
                                    } while (iVar8 != 0x400);
                                    iVar8 = 0;
                                    do {
                                      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
                                                ((uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                 &local_1d8,(test_uintwide_t_edge *)0x0,false,0x4c,
                                                 (int)puVar15);
                                      std::__cxx11::stringstream::stringstream(local_1b8);
                                      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18))
                                           = *(uint *)((long)auStack_190 +
                                                      *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5
                                             | 2;
                                      puVar3 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar3 = *puVar3 | 0x800;
                                      math::wide_integer::operator<<
                                                ((basic_ostream<char,_std::char_traits<char>_> *)
                                                 local_1a8,
                                                 (uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                 &local_1d8);
                                      std::__cxx11::stringbuf::str();
                                      local_218._M_dataplus._M_p._0_4_ = 0;
                                      local_218._M_dataplus._M_p._4_4_ = 0;
                                      local_218._M_string_length._0_4_ = 0;
                                      local_218._M_string_length._4_2_ = 0;
                                      local_218._M_string_length._6_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._0_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._2_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._4_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._6_2_ = 0;
                                      local_218.field_2._8_2_ = 0;
                                      local_218.field_2._10_2_ = 0;
                                      local_218.field_2._12_2_ = 0;
                                      local_218.field_2._14_2_ = 0;
                                      bVar17 = math::wide_integer::
                                               uintwide_t<256U,_unsigned_short,_void,_true>::
                                               rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                  &local_218,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                      if (!bVar17) {
                                        local_218.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                        local_218.field_2._8_2_ = 0xffff;
                                        local_218.field_2._10_2_ = 0xffff;
                                        local_218.field_2._12_2_ = 0xffff;
                                        local_218._M_dataplus._M_p._0_4_ = 0xffffffff;
                                        local_218._M_dataplus._M_p._4_4_ = 0xffffffff;
                                        local_218._M_string_length._0_4_ = 0xffffffff;
                                        local_218._M_string_length._4_2_ = 0xffff;
                                        local_218._M_string_length._6_2_ = 0xffff;
                                        local_218.field_2._14_2_ = 0x7fff;
                                      }
                                      if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8
                                         ) {
                                        operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8)
                                                        ,CONCAT44(uStack_1e4,local_1e8) + 1);
                                      }
                                      if ((short)(local_1d8.values.super_array<unsigned_short,_16UL>
                                                  .elems[0xf] ^ local_218.field_2._14_2_) < 0) {
                                        bVar16 = 0;
                                      }
                                      else {
                                        lVar14 = 0x1e;
                                        do {
                                          bVar13 = 0;
                                          if (lVar14 == -2) break;
                                          uVar4 = *(ushort *)
                                                   ((long)local_1d8.values.
                                                          super_array<unsigned_short,_16UL>.elems +
                                                   lVar14);
                                          uVar5 = *(ushort *)
                                                   ((long)&local_218._M_dataplus._M_p + lVar14);
                                          bVar13 = -(uVar4 <= uVar5) | 1;
                                          lVar14 = lVar14 + -2;
                                        } while (uVar4 == uVar5);
                                        bVar16 = bVar16 & bVar13 == 0;
                                      }
                                      std::__cxx11::stringstream::~stringstream(local_1b8);
                                      std::ios_base::~ios_base(local_138);
                                      iVar8 = iVar8 + 1;
                                    } while (iVar8 != 0x400);
                                    iVar8 = 0;
                                    do {
                                      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
                                                ((uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                 &local_1d8,(test_uintwide_t_edge *)0x0,true,0x40,
                                                 (int)puVar15);
                                      std::__cxx11::stringstream::stringstream(local_1b8);
                                      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18))
                                           = *(uint *)((long)auStack_190 +
                                                      *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5
                                             | 8;
                                      puVar3 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar3 = *puVar3 | 0x200;
                                      puVar3 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar3 = *puVar3 | 0x800;
                                      math::wide_integer::operator<<
                                                ((basic_ostream<char,_std::char_traits<char>_> *)
                                                 local_1a8,
                                                 (uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                 &local_1d8);
                                      std::__cxx11::stringbuf::str();
                                      local_218._M_dataplus._M_p._0_4_ = 0;
                                      local_218._M_dataplus._M_p._4_4_ = 0;
                                      local_218._M_string_length._0_4_ = 0;
                                      local_218._M_string_length._4_2_ = 0;
                                      local_218._M_string_length._6_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._0_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._2_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._4_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._6_2_ = 0;
                                      local_218.field_2._8_2_ = 0;
                                      local_218.field_2._10_2_ = 0;
                                      local_218.field_2._12_2_ = 0;
                                      local_218.field_2._14_2_ = 0;
                                      bVar17 = math::wide_integer::
                                               uintwide_t<256U,_unsigned_short,_void,_true>::
                                               rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                  &local_218,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                      if (!bVar17) {
                                        local_218.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                        local_218.field_2._8_2_ = 0xffff;
                                        local_218.field_2._10_2_ = 0xffff;
                                        local_218.field_2._12_2_ = 0xffff;
                                        local_218._M_dataplus._M_p._0_4_ = 0xffffffff;
                                        local_218._M_dataplus._M_p._4_4_ = 0xffffffff;
                                        local_218._M_string_length._0_4_ = 0xffffffff;
                                        local_218._M_string_length._4_2_ = 0xffff;
                                        local_218._M_string_length._6_2_ = 0xffff;
                                        local_218.field_2._14_2_ = 0x7fff;
                                      }
                                      if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8
                                         ) {
                                        operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8)
                                                        ,CONCAT44(uStack_1e4,local_1e8) + 1);
                                      }
                                      if ((short)(local_1d8.values.super_array<unsigned_short,_16UL>
                                                  .elems[0xf] ^ local_218.field_2._14_2_) < 0) {
                                        bVar16 = 0;
                                      }
                                      else {
                                        lVar14 = 0x1e;
                                        do {
                                          bVar13 = 0;
                                          if (lVar14 == -2) break;
                                          uVar4 = *(ushort *)
                                                   ((long)local_1d8.values.
                                                          super_array<unsigned_short,_16UL>.elems +
                                                   lVar14);
                                          uVar5 = *(ushort *)
                                                   ((long)&local_218._M_dataplus._M_p + lVar14);
                                          bVar13 = -(uVar4 <= uVar5) | 1;
                                          lVar14 = lVar14 + -2;
                                        } while (uVar4 == uVar5);
                                        bVar16 = bVar16 & bVar13 == 0;
                                      }
                                      std::__cxx11::stringstream::~stringstream(local_1b8);
                                      std::ios_base::~ios_base(local_138);
                                      iVar8 = iVar8 + 1;
                                    } while (iVar8 != 0x400);
                                    iVar8 = 0;
                                    do {
                                      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
                                                ((uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                 &local_1d8,(test_uintwide_t_edge *)0x0,true,0x55,
                                                 (int)puVar15);
                                      std::__cxx11::stringstream::stringstream(local_1b8);
                                      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18))
                                           = *(uint *)((long)auStack_190 +
                                                      *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5
                                             | 0x40;
                                      puVar3 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar3 = *puVar3 | 0x200;
                                      puVar3 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar3 = *puVar3 | 0x800;
                                      math::wide_integer::operator<<
                                                ((basic_ostream<char,_std::char_traits<char>_> *)
                                                 local_1a8,
                                                 (uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                 &local_1d8);
                                      std::__cxx11::stringbuf::str();
                                      local_218._M_dataplus._M_p._0_4_ = 0;
                                      local_218._M_dataplus._M_p._4_4_ = 0;
                                      local_218._M_string_length._0_4_ = 0;
                                      local_218._M_string_length._4_2_ = 0;
                                      local_218._M_string_length._6_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._0_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._2_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._4_2_ = 0;
                                      local_218.field_2._M_allocated_capacity._6_2_ = 0;
                                      local_218.field_2._8_2_ = 0;
                                      local_218.field_2._10_2_ = 0;
                                      local_218.field_2._12_2_ = 0;
                                      local_218.field_2._14_2_ = 0;
                                      bVar17 = math::wide_integer::
                                               uintwide_t<256U,_unsigned_short,_void,_true>::
                                               rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                  &local_218,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                      if (!bVar17) {
                                        local_218.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                        local_218.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                        local_218.field_2._8_2_ = 0xffff;
                                        local_218.field_2._10_2_ = 0xffff;
                                        local_218.field_2._12_2_ = 0xffff;
                                        local_218._M_dataplus._M_p._0_4_ = 0xffffffff;
                                        local_218._M_dataplus._M_p._4_4_ = 0xffffffff;
                                        local_218._M_string_length._0_4_ = 0xffffffff;
                                        local_218._M_string_length._4_2_ = 0xffff;
                                        local_218._M_string_length._6_2_ = 0xffff;
                                        local_218.field_2._14_2_ = 0x7fff;
                                      }
                                      if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8
                                         ) {
                                        operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8)
                                                        ,CONCAT44(uStack_1e4,local_1e8) + 1);
                                      }
                                      if ((short)(local_1d8.values.super_array<unsigned_short,_16UL>
                                                  .elems[0xf] ^ local_218.field_2._14_2_) < 0) {
                                        bVar16 = 0;
                                      }
                                      else {
                                        lVar14 = 0x1e;
                                        do {
                                          bVar13 = 0;
                                          if (lVar14 == -2) break;
                                          uVar4 = *(ushort *)
                                                   ((long)local_1d8.values.
                                                          super_array<unsigned_short,_16UL>.elems +
                                                   lVar14);
                                          uVar5 = *(ushort *)
                                                   ((long)&local_218._M_dataplus._M_p + lVar14);
                                          bVar13 = -(uVar4 <= uVar5) | 1;
                                          lVar14 = lVar14 + -2;
                                        } while (uVar4 == uVar5);
                                        bVar16 = bVar16 & bVar13 == 0;
                                      }
                                      std::__cxx11::stringstream::~stringstream(local_1b8);
                                      std::ios_base::~ios_base(local_138);
                                      iVar8 = iVar8 + 1;
                                    } while (iVar8 != 0x400);
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0
                                    ;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xb] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xc] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xd] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xe] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xf] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
                                    bVar17 = math::wide_integer::
                                             uintwide_t<256U,_unsigned_short,_void,_false>::
                                             rd_string(&local_1d8,"-0x1",0xffffffffffffffff,0);
                                    if (!bVar17) {
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[8] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[9] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[10] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xb]
                                           = 0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xc]
                                           = 0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xd]
                                           = 0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xe]
                                           = 0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xf]
                                           = 0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[0] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[1] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[2] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[3] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[4] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[5] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[6] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[7] =
                                           0xffff;
                                    }
                                    std::__cxx11::stringstream::stringstream(local_1b8);
                                    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                                         *(uint *)((long)auStack_190 +
                                                  *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
                                    math::wide_integer::operator<<
                                              ((basic_ostream<char,_std::char_traits<char>_> *)
                                               local_1a8,&local_1d8);
                                    std::__cxx11::stringbuf::str();
                                    local_218._M_dataplus._M_p._0_4_ = 0;
                                    local_218._M_dataplus._M_p._4_4_ = 0;
                                    local_218._M_string_length._0_4_ = 0;
                                    local_218._M_string_length._4_2_ = 0;
                                    local_218._M_string_length._6_2_ = 0;
                                    local_218.field_2._M_allocated_capacity._0_2_ = 0;
                                    local_218.field_2._M_allocated_capacity._2_2_ = 0;
                                    local_218.field_2._M_allocated_capacity._4_2_ = 0;
                                    local_218.field_2._M_allocated_capacity._6_2_ = 0;
                                    local_218.field_2._8_2_ = 0;
                                    local_218.field_2._10_2_ = 0;
                                    local_218.field_2._12_2_ = 0;
                                    local_218.field_2._14_2_ = 0;
                                    bVar17 = math::wide_integer::
                                             uintwide_t<256U,_unsigned_short,_void,_false>::
                                             rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_false> *)
                                                  &local_218,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                    if (!bVar17) {
                                      local_218.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                      local_218.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                      local_218.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                      local_218.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                      local_218.field_2._8_2_ = 0xffff;
                                      local_218.field_2._10_2_ = 0xffff;
                                      local_218.field_2._12_2_ = 0xffff;
                                      local_218.field_2._14_2_ = 0xffff;
                                      local_218._M_dataplus._M_p._0_4_ = 0xffffffff;
                                      local_218._M_dataplus._M_p._4_4_ = 0xffffffff;
                                      local_218._M_string_length._0_4_ = 0xffffffff;
                                      local_218._M_string_length._4_2_ = 0xffff;
                                      local_218._M_string_length._6_2_ = 0xffff;
                                    }
                                    if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8)
                                    {
                                      operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8),
                                                      CONCAT44(uStack_1e4,local_1e8) + 1);
                                    }
                                    local_1f8 = 0xffffffff;
                                    uStack_1f4 = 0xffffffff;
                                    uStack_1f0 = 0xffffffff;
                                    uStack_1ec = 0xffffffff;
                                    local_1e8 = 0xffffffff;
                                    uStack_1e4 = 0xffffffff;
                                    uStack_1e0 = 0xffffffff;
                                    uStack_1dc = 0xffffffff;
                                    lVar14 = 0x1e;
                                    do {
                                      bVar13 = 0;
                                      if (lVar14 == -2) break;
                                      uVar4 = *(ushort *)
                                               ((long)&local_218._M_dataplus._M_p + lVar14);
                                      puVar2 = (ushort *)((long)&local_1f8 + lVar14);
                                      bVar13 = -(uVar4 <= *puVar2) | 1;
                                      lVar14 = lVar14 + -2;
                                    } while (uVar4 == *puVar2);
                                    std::__cxx11::stringstream::~stringstream(local_1b8);
                                    std::ios_base::~ios_base(local_138);
                                    return (bool)(bVar13 == 0 & bVar16);
                                  }
                                }
                              }
                            }
                          }
                        }
                        std::__throw_out_of_range_fmt
                                  (
                                  "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                  );
                      }
                    }
                  }
                }
              }
            }
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
          }
        }
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

auto test_various_ostream_ops() -> bool
{
  auto result_is_ok = true;

  eng_sgn.seed(util::util_pseudorandom_time_point_seed::value<typename eng_sgn_type::result_type>());
  eng_dig.seed(util::util_pseudorandom_time_point_seed::value<typename eng_dig_type::result_type>());

  {
    const auto u = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT32_C(29363)));

    std::stringstream strm;

    strm << std::dec << std::showbase << std::setw(static_cast<std::streamsize>(INT8_C(100))) << std::setfill('#') << u;

    std::string str_ctrl(static_cast<std::size_t>(UINT8_C(100)), '#');

    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(4)))) = '2';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(3)))) = '9';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(2)))) = '3';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(1)))) = '6';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(0)))) = '3';

    const auto result_u_fill_is_ok = (strm.str() == str_ctrl);

    result_is_ok = (result_u_fill_is_ok && result_is_ok);
  }

  {
    const auto u = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT32_C(41719)));

    std::stringstream strm;

    strm << std::hex << std::uppercase << std::showbase << std::setw(static_cast<std::streamsize>(INT8_C(100))) << std::setfill('#') << u;

    std::string str_ctrl(static_cast<std::size_t>(UINT8_C(100)), '#');

    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(5)))) = '0';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(4)))) = 'X';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(3)))) = 'A';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(2)))) = '2';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(1)))) = 'F';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(0)))) = '7';

    const auto result_u_fill_is_ok = (strm.str() == str_ctrl);

    result_is_ok = (result_u_fill_is_ok && result_is_ok);
  }

  {
    const auto u = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT32_C(29363)));

    std::stringstream strm;

    strm << std::oct << std::uppercase << std::showbase << std::setw(static_cast<std::streamsize>(INT8_C(100))) << std::setfill('#') << u;

    std::string str_ctrl(static_cast<std::size_t>(UINT8_C(100)), '#');

    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(5)))) = '0';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(4)))) = '7';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(3)))) = '1';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(2)))) = '2';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(1)))) = '6';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(0)))) = '3';

    const auto result_u_fill_is_ok = (strm.str() == str_ctrl);

    result_is_ok = (result_u_fill_is_ok && result_is_ok);
  }

  {
    const auto z = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT8_C(0)));

    {
      std::stringstream strm;

      strm << std::oct << z;

      const auto result_zero_print_as_oct_is_ok = (strm.str() == "0");

      result_is_ok = (result_zero_print_as_oct_is_ok && result_is_ok);
    }

    {
      std::stringstream strm;

      strm << std::dec << z;

      const auto result_zero_print_as_dec_is_ok = (strm.str() == "0");

      result_is_ok = (result_zero_print_as_dec_is_ok && result_is_ok);
    }

    {
      std::stringstream strm;

      strm << std::hex << z;

      const auto result_zero_print_as_hex_is_ok = (strm.str() == "0");

      result_is_ok = (result_zero_print_as_hex_is_ok && result_is_ok);
    }
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto u =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::dec,
        std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits10
      );

    std::stringstream strm;

    strm << std::dec << u;

    const local_uintwide_t_small_unsigned_type u_strm(strm.str().c_str());

    const auto result_u_is_ok = (u == u_strm);

    result_is_ok = (result_u_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto u =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::hex,
        std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / 4
      );

    std::stringstream strm;

    strm << std::hex << std::showbase << u;

    const local_uintwide_t_small_unsigned_type u_strm(strm.str().c_str());

    const auto result_u_is_ok = (u == u_strm);

    result_is_ok = (result_u_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto u =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::oct,
        std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / 3
      );

    std::stringstream strm;

    strm << std::oct << std::showbase << u;

    const local_uintwide_t_small_unsigned_type u_strm(strm.str().c_str());

    const auto result_u_is_ok = (u == u_strm);

    result_is_ok = (result_u_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto n =
      generate_wide_integer_value<local_uintwide_t_small_signed_type>
      (
        false,
        local_base::dec,
        std::numeric_limits<local_uintwide_t_small_signed_type>::digits10
      );

    std::stringstream strm;

    strm << std::dec << std::showpos << n;

    const local_uintwide_t_small_signed_type n_strm(strm.str().c_str());

    const auto result_n_is_ok = (n == n_strm);

    result_is_ok = (result_n_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto n =
      generate_wide_integer_value<local_uintwide_t_small_signed_type>
      (
        false,
        local_base::hex,
        (std::numeric_limits<local_uintwide_t_small_signed_type>::digits + 1) / 4
      );

    std::stringstream strm;

    strm << std::hex << std::showbase << std::showpos << n;

    const local_uintwide_t_small_signed_type n_strm(strm.str().c_str());

    const auto result_n_is_ok = (n == n_strm);

    result_is_ok = (result_n_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto n =
      generate_wide_integer_value<local_uintwide_t_small_signed_type>
      (
        false,
        local_base::oct,
        (std::numeric_limits<local_uintwide_t_small_signed_type>::digits + 1) / 3
      );

    std::stringstream strm;

    strm << std::oct << std::showbase << std::showpos << n;

    const local_uintwide_t_small_signed_type n_strm(strm.str().c_str());

    const auto result_n_is_ok = (n == n_strm);

    result_is_ok = (result_n_is_ok && result_is_ok);
  }

  {
    const local_uintwide_t_small_unsigned_type m1("-0x1");

    std::stringstream strm;

    strm << std::hex << m1;

    const local_uintwide_t_small_unsigned_type m1_from_strm(strm.str().c_str());

    const auto result_read_and_round_trip_neg_hex_str_is_ok =
    (
      m1_from_strm == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)()
    );

    result_is_ok = (result_read_and_round_trip_neg_hex_str_is_ok && result_is_ok);
  }

  return result_is_ok;
}